

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O1

uint16_t icu_63::expandName(UCharNames *names,uint8_t *name,uint16_t nameLength,
                           UCharNameChoice nameChoice,char *buffer,uint16_t bufferLength)

{
  ushort uVar1;
  uint uVar2;
  UCharNameChoice UVar3;
  uint16_t uVar4;
  byte bVar5;
  uint16_t uVar6;
  ushort uVar7;
  byte *pbVar8;
  byte *pbVar9;
  bool bVar10;
  
  uVar1 = (ushort)names[1].tokenStringOffset;
  if ((nameChoice & ~U_EXTENDED_CHAR_NAME) != U_UNICODE_CHAR_NAME) {
    UVar3 = nameChoice;
    if ((uVar1 < 0x3c) || ((short)names[8].groupStringOffset == -1)) {
      do {
        uVar4 = nameLength;
        if (nameLength != 0) {
          do {
            nameLength = uVar4 - 1;
            bVar5 = *name;
            name = name + 1;
            if (bVar5 == 0x3b) break;
            bVar10 = uVar4 != 1;
            uVar4 = nameLength;
          } while (bVar10);
        }
        bVar10 = 1 < (int)UVar3;
        UVar3 = UVar3 - U_UNICODE_10_CHAR_NAME;
      } while (bVar10);
    }
    else {
      nameLength = 0;
    }
  }
  if (nameLength == 0) {
    uVar4 = 0;
  }
  else {
    uVar2 = names->tokenStringOffset;
    uVar4 = 0;
LAB_001c4d54:
    do {
      uVar6 = nameLength - 1;
      pbVar8 = name + 1;
      bVar5 = *name;
      if (bVar5 < uVar1) {
        uVar7 = *(ushort *)((long)&names[1].tokenStringOffset + (ulong)(ushort)bVar5 * 2 + 2);
        if (uVar7 == 0xfffe) {
          pbVar8 = name + 2;
          uVar7 = *(ushort *)
                   ((long)&names[1].tokenStringOffset +
                   (ulong)((uint)(ushort)bVar5 * 0x200 + (uint)name[1] * 2) + 2);
          uVar6 = nameLength - 2;
        }
        nameLength = uVar6;
        if (uVar7 == 0xffff) {
          uVar6 = nameLength;
          if (bVar5 != 0x3b) goto LAB_001c4dd7;
          if ((((nameChoice != U_EXTENDED_CHAR_NAME) || (uVar4 != 0)) ||
              ((0x3b < uVar1 && ((short)names[8].groupStringOffset != -1)))) ||
             (uVar4 = 0, name = pbVar8, nameLength == 0)) break;
          goto LAB_001c4d54;
        }
        bVar5 = *(byte *)((long)&names->tokenStringOffset + (ulong)uVar7 + (ulong)uVar2);
        if (bVar5 != 0) {
          pbVar9 = (byte *)((long)&names->tokenStringOffset + (ulong)uVar7 + (ulong)uVar2 + 1);
          do {
            if (bufferLength != 0) {
              *buffer = bVar5;
              buffer = (char *)((byte *)buffer + 1);
              bufferLength = bufferLength - 1;
            }
            uVar4 = uVar4 + 1;
            bVar5 = *pbVar9;
            pbVar9 = pbVar9 + 1;
          } while (bVar5 != 0);
        }
      }
      else {
        if (bVar5 == 0x3b) break;
LAB_001c4dd7:
        if (bufferLength != 0) {
          *buffer = bVar5;
          buffer = (char *)((byte *)buffer + 1);
          bufferLength = bufferLength - 1;
        }
        uVar4 = uVar4 + 1;
        nameLength = uVar6;
      }
      name = pbVar8;
    } while (nameLength != 0);
  }
  if (bufferLength != 0) {
    *buffer = 0;
  }
  return uVar4;
}

Assistant:

static uint16_t
expandName(UCharNames *names,
           const uint8_t *name, uint16_t nameLength, UCharNameChoice nameChoice,
           char *buffer, uint16_t bufferLength) {
    uint16_t *tokens=(uint16_t *)names+8;
    uint16_t token, tokenCount=*tokens++, bufferPos=0;
    uint8_t *tokenStrings=(uint8_t *)names+names->tokenStringOffset;
    uint8_t c;

    if(nameChoice!=U_UNICODE_CHAR_NAME && nameChoice!=U_EXTENDED_CHAR_NAME) {
        /*
         * skip the modern name if it is not requested _and_
         * if the semicolon byte value is a character, not a token number
         */
        if((uint8_t)';'>=tokenCount || tokens[(uint8_t)';']==(uint16_t)(-1)) {
            int fieldIndex= nameChoice==U_ISO_COMMENT ? 2 : nameChoice;
            do {
                while(nameLength>0) {
                    --nameLength;
                    if(*name++==';') {
                        break;
                    }
                }
            } while(--fieldIndex>0);
        } else {
            /*
             * the semicolon byte value is a token number, therefore
             * only modern names are stored in unames.dat and there is no
             * such requested alternate name here
             */
            nameLength=0;
        }
    }

    /* write each letter directly, and write a token word per token */
    while(nameLength>0) {
        --nameLength;
        c=*name++;

        if(c>=tokenCount) {
            if(c!=';') {
                /* implicit letter */
                WRITE_CHAR(buffer, bufferLength, bufferPos, c);
            } else {
                /* finished */
                break;
            }
        } else {
            token=tokens[c];
            if(token==(uint16_t)(-2)) {
                /* this is a lead byte for a double-byte token */
                token=tokens[c<<8|*name++];
                --nameLength;
            }
            if(token==(uint16_t)(-1)) {
                if(c!=';') {
                    /* explicit letter */
                    WRITE_CHAR(buffer, bufferLength, bufferPos, c);
                } else {
                    /* stop, but skip the semicolon if we are seeking
                       extended names and there was no 2.0 name but there
                       is a 1.0 name. */
                    if(!bufferPos && nameChoice == U_EXTENDED_CHAR_NAME) {
                        if ((uint8_t)';'>=tokenCount || tokens[(uint8_t)';']==(uint16_t)(-1)) {
                            continue;
                        }
                    }
                    /* finished */
                    break;
                }
            } else {
                /* write token word */
                uint8_t *tokenString=tokenStrings+token;
                while((c=*tokenString++)!=0) {
                    WRITE_CHAR(buffer, bufferLength, bufferPos, c);
                }
            }
        }
    }

    /* zero-terminate */
    if(bufferLength>0) {
        *buffer=0;
    }

    return bufferPos;
}